

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

HighsInt __thiscall
HighsDomain::propagateRowLower
          (HighsDomain *this,HighsInt *Rindex,double *Rvalue,HighsInt Rlen,double Rlower,
          HighsCDouble *maxactivity,HighsInt ninfmax,HighsDomainChange *boundchgs)

{
  uint uVar1;
  HighsCDouble boundVal_00;
  reference lb;
  reference ub;
  pointer pHVar2;
  double *pdVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar4;
  HighsDomain *this_00;
  double dVar5;
  HighsCDouble HVar6;
  long in_stack_00000008;
  double bound_1;
  bool accept_1;
  double bound;
  bool accept;
  HighsCDouble boundVal;
  double actcontribution;
  HighsCDouble maxresact;
  HighsInt i;
  HighsInt numchgs;
  HighsCDouble *in_stack_fffffffffffffee8;
  HighsCDouble *in_stack_fffffffffffffef0;
  HighsCDouble *b;
  byte local_c1;
  byte local_91;
  HighsInt col;
  undefined4 uVar7;
  HighsInt col_00;
  HighsDomain *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  int local_44;
  int local_40;
  HighsInt local_4;
  bool *accept_00;
  
  if (in_R9D < 2) {
    local_40 = 0;
    for (local_44 = 0; local_44 != in_ECX; local_44 = local_44 + 1) {
      b = *(HighsCDouble **)(in_RDX + (long)local_44 * 8);
      lb = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x308),
                      (long)*(int *)(in_RSI + (long)local_44 * 4));
      ub = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 800),
                      (long)*(int *)(in_RSI + (long)local_44 * 4));
      dVar4 = activityContributionMax((double)b,lb,ub);
      if (in_R9D == 1) {
        if ((dVar4 == INFINITY) && (!NAN(dVar4))) goto LAB_005c2d41;
      }
      else {
        HVar6 = HighsCDouble::operator-(in_stack_fffffffffffffef0,(double)in_stack_fffffffffffffee8)
        ;
        in_stack_ffffffffffffff90 = (HighsDomain *)HVar6.hi;
        in_stack_ffffffffffffff98 = HVar6.lo;
LAB_005c2d41:
        HVar6 = ::operator-((double)lb,b);
        accept_00 = (bool *)HVar6.hi;
        col = HVar6.lo._4_4_;
        HVar6 = HighsCDouble::operator/(in_stack_fffffffffffffee8,2.98463623862324e-317);
        this_00 = (HighsDomain *)HVar6.hi;
        uVar7 = HVar6.lo._0_4_;
        col_00 = HVar6.lo._4_4_;
        dVar5 = HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xffffffffffffff80);
        in_stack_fffffffffffffef0 = (HighsCDouble *)ABS(dVar5 * 1e-14);
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5c2ddf);
        if ((double)in_stack_fffffffffffffef0 < pHVar2->feastol ||
            (double)in_stack_fffffffffffffef0 == pHVar2->feastol) {
          pdVar3 = (double *)(in_RDX + (long)local_44 * 8);
          if (0.0 < *pdVar3 || *pdVar3 == 0.0) {
            HVar6.lo = dVar4;
            HVar6.hi = in_stack_ffffffffffffff98;
            dVar4 = adjustedLb(in_stack_ffffffffffffff90,col_00,HVar6,(bool *)this_00);
            if ((local_c1 & 1) != 0) {
              uVar1 = *(uint *)(in_RSI + (long)local_44 * 4);
              pdVar3 = (double *)(in_stack_00000008 + (long)local_40 * 0x10);
              *pdVar3 = dVar4;
              pdVar3[1] = (double)(ulong)uVar1;
              local_40 = local_40 + 1;
            }
          }
          else {
            boundVal_00.hi._4_4_ = col_00;
            boundVal_00.hi._0_4_ = uVar7;
            boundVal_00.lo = (double)in_stack_ffffffffffffff90;
            dVar4 = adjustedUb(this_00,col,boundVal_00,accept_00);
            if ((local_91 & 1) != 0) {
              uVar7 = *(undefined4 *)(in_RSI + (long)local_44 * 4);
              pdVar3 = (double *)(in_stack_00000008 + (long)local_40 * 0x10);
              *pdVar3 = dVar4;
              pdVar3[1] = (double)CONCAT44(1,uVar7);
              local_40 = local_40 + 1;
            }
          }
        }
      }
    }
    local_4 = local_40;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

HighsInt HighsDomain::propagateRowLower(const HighsInt* Rindex,
                                        const double* Rvalue, HighsInt Rlen,
                                        double Rlower,
                                        const HighsCDouble& maxactivity,
                                        HighsInt ninfmax,
                                        HighsDomainChange* boundchgs) {
  assert(std::isfinite(double(maxactivity)));
  if (ninfmax > 1) return 0;
  HighsInt numchgs = 0;
  for (HighsInt i = 0; i != Rlen; ++i) {
    HighsCDouble maxresact;
    double actcontribution = activityContributionMax(
        Rvalue[i], col_lower_[Rindex[i]], col_upper_[Rindex[i]]);
    if (ninfmax == 1) {
      if (actcontribution != kHighsInf) continue;

      maxresact = maxactivity;
    } else {
      maxresact = maxactivity - actcontribution;
    }

    HighsCDouble boundVal = (Rlower - maxresact) / Rvalue[i];
    if (std::fabs(double(boundVal) * kHighsTiny) > mipsolver->mipdata_->feastol)
      continue;

    if (Rvalue[i] < 0) {
      bool accept;

      double bound = adjustedUb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kUpper};
    } else {
      bool accept;

      double bound = adjustedLb(Rindex[i], boundVal, accept);
      if (accept)
        boundchgs[numchgs++] = {bound, Rindex[i], HighsBoundType::kLower};
    }
  }

  return numchgs;
}